

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_59::InMemoryDirectory::Impl::openEntry(Impl *this,StringPtr name,WriteMode mode)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  undefined8 uVar4;
  Clock *pCVar5;
  iterator iVar6;
  undefined4 in_register_0000000c;
  char *pcVar7;
  uint in_R8D;
  _Base_ptr *pp_Var8;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_EntryImpl>_>::value,_pair<iterator,_bool>_>
  _Var9;
  EntryImpl entry;
  String local_d8;
  long local_b8;
  undefined8 uStack_b0;
  ArrayDisposer *local_a8;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  local_a0;
  pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl> local_70;
  
  pcVar7 = name.content.ptr;
  heapString(&local_d8,(char *)name.content.size_,CONCAT44(in_register_0000000c,mode) - 1);
  sVar2 = local_d8.content.size_;
  pcVar1 = local_d8.content.ptr;
  if ((in_R8D & 1) == 0) {
    if ((in_R8D & 2) == 0) {
      this->clock = (Clock *)0x0;
    }
    else {
      local_70.first.content.ptr = local_d8.content.ptr;
      if (local_d8.content.size_ == 0) {
        local_70.first.content.ptr = "";
      }
      local_70.first.content.size_ = local_d8.content.size_ + (local_d8.content.size_ == 0);
      iVar6 = std::
              map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
              ::find((map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
                      *)(pcVar7 + 0x10),&local_70.first);
      pCVar5 = (Clock *)0x0;
      if (iVar6._M_node != (_Base_ptr)(pcVar7 + 0x18)) {
        pCVar5 = (Clock *)&iVar6._M_node[1]._M_left;
      }
      this->clock = pCVar5;
    }
  }
  else {
    local_a8 = local_d8.content.disposer;
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    local_a0.tag = 0;
    local_70.first.content.ptr = "";
    if (sVar2 != 0) {
      local_70.first.content.ptr = pcVar1;
    }
    local_70.first.content.size_ = sVar2 + (sVar2 == 0);
    local_70.second.name.content.ptr = pcVar1;
    local_70.second.name.content.size_ = sVar2;
    local_70.second.name.content.disposer = local_d8.content.disposer;
    local_b8 = 0;
    uStack_b0 = 0;
    local_70.second.node.tag = 0;
    _Var9 = std::
            map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
            ::
            insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                      ((map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                        *)(pcVar7 + 0x10),&local_70);
    OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
    ::destroy(&local_70.second.node);
    sVar2 = local_70.second.name.content.size_;
    pcVar1 = local_70.second.name.content.ptr;
    if (local_70.second.name.content.ptr != (char *)0x0) {
      local_70.second.name.content.ptr = (char *)0x0;
      local_70.second.name.content.size_ = 0;
      (**(local_70.second.name.content.disposer)->_vptr_ArrayDisposer)
                (local_70.second.name.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
    pp_Var8 = &_Var9.first._M_node._M_node[1]._M_left;
    pCVar5 = (Clock *)0x0;
    if (((undefined1  [16])_Var9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pCVar5 = (Clock *)pp_Var8;
    }
    if ((in_R8D & 2) != 0) {
      pCVar5 = (Clock *)pp_Var8;
    }
    this->clock = pCVar5;
    OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
    ::destroy(&local_a0);
    uVar4 = uStack_b0;
    lVar3 = local_b8;
    if (local_b8 != 0) {
      local_b8 = 0;
      uStack_b0 = 0;
      (**local_a8->_vptr_ArrayDisposer)(local_a8,lVar3,1,uVar4,uVar4,0);
    }
  }
  sVar2 = local_d8.content.size_;
  pcVar1 = local_d8.content.ptr;
  if (local_d8.content.ptr != (char *)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return (Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)(EntryImpl *)this;
}

Assistant:

Maybe<EntryImpl&> openEntry(kj::StringPtr name, WriteMode mode) {
      // TODO(perf): We could avoid a copy if the entry exists, at the expense of a double-lookup
      //   if it doesn't. Maybe a better map implementation will solve everything?
      return openEntry(heapString(name), mode);
    }